

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O0

void Abc_TruthDecPerform(Abc_TtStore_t *p,int DecType,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  Vec_Str_t *p_00;
  Vec_Int_t *p_01;
  Dec_Graph_t *pGraph;
  word *pool;
  abctime aVar3;
  char *pcVar4;
  word **local_8a8;
  word *mem_pool;
  char pDsd_1 [64];
  char local_848 [4];
  int nSuppSize;
  char pDsd [2000];
  Kit_DsdNtk_t *pNtk;
  Bdc_Par_t *pPars;
  Bdc_Par_t Pars;
  Bdc_Man_t *pManDec;
  char *pSopStr;
  Vec_Str_t *vStr;
  Vec_Int_t *vCover;
  Dec_Graph_t *pFForm;
  char *pAlgoName;
  int nNodes;
  int i;
  abctime clk;
  int fVerbose_local;
  int DecType_local;
  Abc_TtStore_t *p_local;
  
  aVar2 = Abc_Clock();
  pAlgoName._0_4_ = 0;
  pFForm = (Dec_Graph_t *)0x0;
  if (DecType == 1) {
    pFForm = (Dec_Graph_t *)0xd3869d;
  }
  else if (DecType == 2) {
    pFForm = (Dec_Graph_t *)anon_var_dwarf_85ed5;
  }
  else if (DecType == 3) {
    pFForm = (Dec_Graph_t *)0xc642c2;
  }
  else if (DecType == 4) {
    pFForm = (Dec_Graph_t *)anon_var_dwarf_85eeb;
  }
  else if (DecType == 5) {
    pFForm = (Dec_Graph_t *)anon_var_dwarf_85f02;
  }
  else if (DecType == 6) {
    pFForm = (Dec_Graph_t *)anon_var_dwarf_85f0d;
  }
  if (pFForm != (Dec_Graph_t *)0x0) {
    pcVar4 = "s";
    if (p->nFuncs == 1) {
      pcVar4 = "";
    }
    printf("Applying %-10s to %8d func%s of %2d vars...  ",pFForm,(ulong)(uint)p->nFuncs,pcVar4,
           (ulong)(uint)p->nVars);
  }
  if (fVerbose != 0) {
    printf("\n");
  }
  if (DecType == 1) {
    p_00 = Vec_StrAlloc(10000);
    p_01 = Vec_IntAlloc(0x10000);
    for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
        pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
      if (fVerbose != 0) {
        printf("%7d : ",(ulong)pAlgoName._4_4_);
      }
      pcVar4 = Kit_PlaFromTruthNew((uint *)p->pFuncs[(int)pAlgoName._4_4_],p->nVars,p_01,p_00);
      pGraph = Dec_Factor(pcVar4);
      iVar1 = Dec_GraphNodeNum(pGraph);
      pAlgoName._0_4_ = iVar1 + (uint)pAlgoName;
      if (fVerbose != 0) {
        Dec_GraphPrint(_stdout,pGraph,(char **)0x0,(char *)0x0);
      }
      Dec_GraphFree(pGraph);
    }
    Vec_IntFree(p_01);
    Vec_StrFree(p_00);
  }
  else if (DecType == 2) {
    memset((void *)((long)&pPars + 4),0,0xc);
    pPars._4_4_ = p->nVars;
    Pars._4_8_ = Bdc_ManAlloc((Bdc_Par_t *)((long)&pPars + 4));
    for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
        pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
      if (fVerbose != 0) {
        printf("%7d :      ",(ulong)pAlgoName._4_4_);
      }
      Bdc_ManDecompose((Bdc_Man_t *)Pars._4_8_,(uint *)p->pFuncs[(int)pAlgoName._4_4_],(uint *)0x0,
                       p->nVars,(Vec_Ptr_t *)0x0,1000);
      iVar1 = Bdc_ManAndNum((Bdc_Man_t *)Pars._4_8_);
      pAlgoName._0_4_ = iVar1 + (uint)pAlgoName;
      if (fVerbose != 0) {
        Bdc_ManDecPrint((Bdc_Man_t *)Pars._4_8_);
      }
    }
    Bdc_ManFree((Bdc_Man_t *)Pars._4_8_);
  }
  else if (DecType == 3) {
    for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
        pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
      if (fVerbose != 0) {
        printf("%7d :      ",(ulong)pAlgoName._4_4_);
      }
      pDsd._1992_8_ = Kit_DsdDecomposeMux((uint *)p->pFuncs[(int)pAlgoName._4_4_],p->nVars,3);
      if (fVerbose != 0) {
        Kit_DsdPrintExpanded((Kit_DsdNtk_t *)pDsd._1992_8_);
        printf("\n");
      }
      iVar1 = Kit_DsdCountAigNodes((Kit_DsdNtk_t *)pDsd._1992_8_);
      pAlgoName._0_4_ = iVar1 + (uint)pAlgoName;
      Kit_DsdNtkFree((Kit_DsdNtk_t *)pDsd._1992_8_);
    }
  }
  else if (DecType == 4) {
    for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
        pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
      if (fVerbose != 0) {
        printf("%7d :      ",(ulong)pAlgoName._4_4_);
      }
      Dau_DsdDecompose(p->pFuncs[(int)pAlgoName._4_4_],p->nVars,0,1,local_848);
      if (fVerbose != 0) {
        printf("%s\n",local_848);
      }
      iVar1 = Dau_DsdCountAnds(local_848);
      pAlgoName._0_4_ = iVar1 + (uint)pAlgoName;
    }
  }
  else if (DecType == 5) {
    for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
        pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
      iVar1 = Abc_TtSupportSize(p->pFuncs[(int)pAlgoName._4_4_],p->nVars);
      if (fVerbose != 0) {
        printf("%7d :      ",(ulong)pAlgoName._4_4_);
      }
      Dau_DecTrySets(p->pFuncs[(int)pAlgoName._4_4_],iVar1,fVerbose);
      if (fVerbose != 0) {
        printf("\n");
      }
    }
  }
  else {
    if (DecType != 6) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDec.c"
                    ,0x2a7,"void Abc_TruthDecPerform(Abc_TtStore_t *, int, int)");
    }
    pool = Dsc_alloc_pool(p->nVars);
    for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
        pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
      if (fVerbose != 0) {
        printf("%7d :      ",(ulong)pAlgoName._4_4_);
      }
      Dsc_Decompose(p->pFuncs[(int)pAlgoName._4_4_],p->nVars,(char *)&mem_pool,pool);
      if (fVerbose != 0) {
        if ((char)mem_pool == '\0') {
          local_8a8 = (word **)0xcedb49;
        }
        else {
          local_8a8 = &mem_pool;
        }
        printf("%s\n",local_8a8);
      }
      iVar1 = Dsc_CountAnds((char *)&mem_pool);
      pAlgoName._0_4_ = iVar1 + (uint)pAlgoName;
    }
    Dsc_free_pool(pool);
  }
  printf("AIG nodes =%9d  ",(ulong)(uint)pAlgoName);
  aVar3 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar3 - aVar2);
  return;
}

Assistant:

void Abc_TruthDecPerform( Abc_TtStore_t * p, int DecType, int fVerbose )
{
    abctime clk = Abc_Clock();
    int i, nNodes = 0;

    char * pAlgoName = NULL;
    if ( DecType == 1 )
        pAlgoName = "factoring";
    else if ( DecType == 2 )
        pAlgoName = "bi-decomp";
    else if ( DecType == 3 )
        pAlgoName = "DSD";
    else if ( DecType == 4 )
        pAlgoName = "fast DSD";
    else if ( DecType == 5 )
        pAlgoName = "analysis";
    else if ( DecType == 6 )
            pAlgoName = "DSD ICCD'15";

    if ( pAlgoName )
        printf( "Applying %-10s to %8d func%s of %2d vars...  ",  
            pAlgoName, p->nFuncs, (p->nFuncs == 1 ? "":"s"), p->nVars );
    if ( fVerbose )
        printf( "\n" );

    if ( DecType == 1 )
    {
        // perform algebraic factoring and count AIG nodes
        Dec_Graph_t * pFForm;
        Vec_Int_t * vCover;
        Vec_Str_t * vStr;
        char * pSopStr;
        vStr = Vec_StrAlloc( 10000 );
        vCover = Vec_IntAlloc( 1 << 16 );
        for ( i = 0; i < p->nFuncs; i++ )
        {
//            extern int Abc_IsopTest( word * pFunc, int nVars, Vec_Int_t * vCover );
//            if ( i == 0 ) printf( "\n" );
//            Abc_IsopTest( p->pFuncs[i], p->nVars, vCover );
//            continue;
            if ( fVerbose )
                printf( "%7d : ", i );
            pSopStr = Kit_PlaFromTruthNew( (unsigned *)p->pFuncs[i], p->nVars, vCover, vStr );
            pFForm = Dec_Factor( pSopStr );
            nNodes += Dec_GraphNodeNum( pFForm );
            if ( fVerbose )
                Dec_GraphPrint( stdout, pFForm, NULL, NULL );
            Dec_GraphFree( pFForm );
        }
        Vec_IntFree( vCover );
        Vec_StrFree( vStr );
    }
    else if ( DecType == 2 )
    {
        // perform bi-decomposition and count AIG nodes
        Bdc_Man_t * pManDec;
        Bdc_Par_t Pars = {0}, * pPars = &Pars;
        pPars->nVarsMax = p->nVars;
        pManDec = Bdc_ManAlloc( pPars );
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d :      ", i );
            Bdc_ManDecompose( pManDec, (unsigned *)p->pFuncs[i], NULL, p->nVars, NULL, 1000 );
            nNodes += Bdc_ManAndNum( pManDec );
            if ( fVerbose )
                Bdc_ManDecPrint( pManDec );
        }
        Bdc_ManFree( pManDec );
    }
    else if ( DecType == 3 )
    {
        // perform disjoint-support decomposition and count AIG nodes
        // (non-DSD blocks are decomposed into 2:1 MUXes, each counting as 3 AIG nodes)
        Kit_DsdNtk_t * pNtk;
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d :      ", i );
            pNtk = Kit_DsdDecomposeMux( (unsigned *)p->pFuncs[i], p->nVars, 3 );
            if ( fVerbose )
                Kit_DsdPrintExpanded( pNtk ), printf( "\n" );
            nNodes += Kit_DsdCountAigNodes( pNtk );
            Kit_DsdNtkFree( pNtk );
        }
    }
    else if ( DecType == 4 )
    {
        char pDsd[DAU_MAX_STR];
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d :      ", i );
            Dau_DsdDecompose( p->pFuncs[i], p->nVars, 0, 1, pDsd );
            if ( fVerbose )
                printf( "%s\n", pDsd );
            nNodes += Dau_DsdCountAnds( pDsd );
        }
    }
    else if ( DecType == 5 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            extern void Dau_DecTrySets( word * pInit, int nVars, int fVerbose );
            int nSuppSize = Abc_TtSupportSize( p->pFuncs[i], p->nVars );
            if ( fVerbose )
                printf( "%7d :      ", i );
            Dau_DecTrySets( p->pFuncs[i], nSuppSize, fVerbose );
            if ( fVerbose )
                printf( "\n" );
        }
    } else if ( DecType == 6 )
    {
        char pDsd[DSC_MAX_STR];
        /* memory pool with a capacity of storing 3*nVars
        truth-tables for negative and positive cofactors and
        the boolean difference for each input variable */
        word *mem_pool = Dsc_alloc_pool(p->nVars);
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d :      ", i );
            Dsc_Decompose(p->pFuncs[i], p->nVars, pDsd, mem_pool);
            if ( fVerbose )
                printf( "%s\n", pDsd[0] ? pDsd : "NULL");
            nNodes += Dsc_CountAnds( pDsd );
        }
        Dsc_free_pool(mem_pool);
    }
    else assert( 0 );

    printf( "AIG nodes =%9d  ", nNodes );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}